

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O3

void writeimage(void)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  void *__ptr;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int status;
  fitsfile *fptr;
  long naxes [2];
  char filename [13];
  long exposure;
  unsigned_short *array [200];
  int local_694;
  undefined8 local_690;
  long local_688;
  long lStack_680;
  char local_670 [16];
  undefined8 local_660;
  void *local_658;
  long local_650 [200];
  long lVar16;
  
  builtin_strncpy(local_670 + 8,".fit",5);
  builtin_strncpy(local_670,"atestfil",8);
  local_688 = 300;
  lStack_680 = 200;
  __ptr = malloc(120000);
  lVar6 = 0;
  pvVar7 = __ptr;
  do {
    auVar12._8_4_ = (int)pvVar7;
    auVar12._0_8_ = pvVar7;
    auVar12._12_4_ = (int)((ulong)pvVar7 >> 0x20);
    auVar13._8_4_ = (int)lVar6;
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar13 = (auVar13 | _DAT_00104010) ^ _DAT_00104020;
    if (auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7fffff39) {
      local_650[lVar6] = (long)pvVar7 + 600;
      local_650[lVar6 + 1] = auVar12._8_8_ + 0x4b0;
    }
    lVar6 = lVar6 + 2;
    pvVar7 = (void *)((long)pvVar7 + 0x4b0);
  } while (lVar6 != 200);
  local_658 = __ptr;
  remove(local_670);
  local_694 = 0;
  iVar5 = ffinit(&local_690,local_670);
  if (iVar5 != 0) {
    printerror(local_694);
  }
  iVar5 = ffcrim(local_690,0x14,2,&local_688);
  if (iVar5 != 0) {
    printerror(local_694);
  }
  auVar4 = _DAT_00104070;
  auVar3 = _DAT_00104060;
  auVar13 = _DAT_00104050;
  auVar12 = _DAT_00104010;
  if (0 < lStack_680) {
    lVar6 = local_688 + -1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00104020;
    auVar14._8_4_ = 0xffffffff;
    auVar14._0_8_ = 0xffffffffffffffff;
    auVar14._12_4_ = 0xffffffff;
    auVar35 = _DAT_00104020;
    do {
      if (0 < local_688) {
        pvVar7 = (&local_658)[lVar6];
        uVar8 = 0;
        auVar15 = auVar12;
        auVar17 = auVar4;
        auVar18 = auVar3;
        auVar19 = auVar13;
        do {
          auVar20 = auVar15 ^ auVar35;
          iVar5 = auVar9._0_4_;
          iVar29 = -(uint)(iVar5 < auVar20._0_4_);
          iVar10 = auVar9._4_4_;
          auVar21._4_4_ = -(uint)(iVar10 < auVar20._4_4_);
          iVar33 = auVar9._8_4_;
          iVar32 = -(uint)(iVar33 < auVar20._8_4_);
          iVar11 = auVar9._12_4_;
          auVar21._12_4_ = -(uint)(iVar11 < auVar20._12_4_);
          auVar26._4_4_ = iVar29;
          auVar26._0_4_ = iVar29;
          auVar26._8_4_ = iVar32;
          auVar26._12_4_ = iVar32;
          auVar34 = pshuflw(in_XMM13,auVar26,0xe8);
          auVar25._4_4_ = -(uint)(auVar20._4_4_ == iVar10);
          auVar25._12_4_ = -(uint)(auVar20._12_4_ == iVar11);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar20 = pshuflw(auVar35,auVar25,0xe8);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar35 = pshuflw(auVar34,auVar21,0xe8);
          auVar35 = (auVar35 | auVar20 & auVar34) ^ auVar14;
          auVar35 = packssdw(auVar35,auVar35);
          sVar1 = (short)lVar6;
          sVar2 = (short)uVar8;
          if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2) = sVar1 + sVar2;
          }
          auVar21 = auVar25 & auVar26 | auVar21;
          auVar35 = packssdw(auVar21,auVar21);
          auVar35 = packssdw(auVar35 ^ auVar14,auVar35 ^ auVar14);
          if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 2) = sVar1 + sVar2 + 1;
          }
          auVar35 = _DAT_00104020;
          auVar25 = auVar17 ^ _DAT_00104020;
          iVar29 = -(uint)(iVar5 < auVar25._0_4_);
          auVar30._4_4_ = -(uint)(iVar10 < auVar25._4_4_);
          iVar32 = -(uint)(iVar33 < auVar25._8_4_);
          auVar30._12_4_ = -(uint)(iVar11 < auVar25._12_4_);
          auVar20._4_4_ = iVar29;
          auVar20._0_4_ = iVar29;
          auVar20._8_4_ = iVar32;
          auVar20._12_4_ = iVar32;
          auVar34._4_4_ = -(uint)(auVar25._4_4_ == iVar10);
          auVar34._12_4_ = -(uint)(auVar25._12_4_ == iVar11);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar25 = auVar34 & auVar20 | auVar30;
          auVar25 = packssdw(auVar25,auVar25);
          auVar25 = packssdw(auVar25 ^ auVar14,auVar25 ^ auVar14);
          if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 4) = sVar1 + sVar2 + 2;
          }
          auVar20 = pshufhw(auVar20,auVar20,0x84);
          auVar26 = pshufhw(auVar34,auVar34,0x84);
          auVar21 = pshufhw(auVar20,auVar30,0x84);
          auVar20 = (auVar21 | auVar26 & auVar20) ^ auVar14;
          auVar20 = packssdw(auVar20,auVar20);
          if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 6) = sVar1 + sVar2 + 3;
          }
          auVar20 = auVar18 ^ auVar35;
          iVar29 = -(uint)(iVar5 < auVar20._0_4_);
          auVar23._4_4_ = -(uint)(iVar10 < auVar20._4_4_);
          iVar32 = -(uint)(iVar33 < auVar20._8_4_);
          auVar23._12_4_ = -(uint)(iVar11 < auVar20._12_4_);
          auVar27._4_4_ = iVar29;
          auVar27._0_4_ = iVar29;
          auVar27._8_4_ = iVar32;
          auVar27._12_4_ = iVar32;
          auVar25 = pshuflw(auVar25,auVar27,0xe8);
          auVar22._4_4_ = -(uint)(auVar20._4_4_ == iVar10);
          auVar22._12_4_ = -(uint)(auVar20._12_4_ == iVar11);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar20 = pshuflw(auVar35,auVar22,0xe8);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar35 = pshuflw(auVar25,auVar23,0xe8);
          auVar35 = (auVar35 | auVar20 & auVar25) ^ auVar14;
          auVar35 = packssdw(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 8) = sVar1 + sVar2 + 4;
          }
          auVar23 = auVar22 & auVar27 | auVar23;
          auVar35 = packssdw(auVar23,auVar23);
          auVar35 = packssdw(auVar35 ^ auVar14,auVar35 ^ auVar14);
          if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 10) = sVar1 + sVar2 + 5;
          }
          auVar35 = _DAT_00104020;
          auVar20 = auVar19 ^ _DAT_00104020;
          iVar5 = -(uint)(iVar5 < auVar20._0_4_);
          auVar31._4_4_ = -(uint)(iVar10 < auVar20._4_4_);
          iVar33 = -(uint)(iVar33 < auVar20._8_4_);
          auVar31._12_4_ = -(uint)(iVar11 < auVar20._12_4_);
          auVar24._4_4_ = iVar5;
          auVar24._0_4_ = iVar5;
          auVar24._8_4_ = iVar33;
          auVar24._12_4_ = iVar33;
          auVar28._4_4_ = -(uint)(auVar20._4_4_ == iVar10);
          auVar28._12_4_ = -(uint)(auVar20._12_4_ == iVar11);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar20 = auVar28 & auVar24 | auVar31;
          auVar20 = packssdw(auVar20,auVar20);
          in_XMM13 = packssdw(auVar20 ^ auVar14,auVar20 ^ auVar14);
          if ((in_XMM13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 0xc) = sVar1 + sVar2 + 6;
          }
          auVar20 = pshufhw(auVar24,auVar24,0x84);
          auVar21 = pshufhw(auVar28,auVar28,0x84);
          auVar25 = pshufhw(auVar20,auVar31,0x84);
          auVar20 = (auVar25 | auVar21 & auVar20) ^ auVar14;
          auVar20 = packssdw(auVar20,auVar20);
          if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)pvVar7 + uVar8 * 2 + 0xe) = sVar1 + sVar2 + 7;
          }
          uVar8 = uVar8 + 8;
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 8;
          auVar15._8_8_ = lVar16 + 8;
          lVar16 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 8;
          auVar17._8_8_ = lVar16 + 8;
          lVar16 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 8;
          auVar18._8_8_ = lVar16 + 8;
          lVar16 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 8;
          auVar19._8_8_ = lVar16 + 8;
        } while ((local_688 + 7U & 0xfffffffffffffff8) != uVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lStack_680);
  }
  iVar5 = ffppr(local_690,0x14,1,local_688 * lStack_680,__ptr,&local_694);
  if (iVar5 != 0) {
    printerror(local_694);
  }
  free(__ptr);
  local_660 = 0x5dc;
  iVar5 = ffuky(local_690,0x29,"EXPOSURE",&local_660,"Total Exposure Time",&local_694);
  if (iVar5 != 0) {
    printerror(local_694);
  }
  iVar5 = ffclos(local_690,&local_694);
  if (iVar5 != 0) {
    printerror(local_694);
  }
  return;
}

Assistant:

void writeimage( void )

    /******************************************************/
    /* Create a FITS primary array containing a 2-D image */
    /******************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, ii, jj;
    long  fpixel, nelements, exposure;
    unsigned short *array[200];

    /* initialize FITS image parameters */
    char filename[] = "atestfil.fit";             /* name for new FITS file */
    int bitpix   =  USHORT_IMG; /* 16-bit unsigned short pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = { 300, 200 };   /* image is 300 pixels wide by 200 rows */

    /* allocate memory for the whole image */ 
    array[0] = (unsigned short *)malloc( naxes[0] * naxes[1]
                                        * sizeof( unsigned short ) );

    /* initialize pointers to the start of each row of the image */
    for( ii=1; ii<naxes[1]; ii++ )
      array[ii] = array[ii-1] + naxes[0];

    remove(filename);               /* Delete old file if it already exists */

    status = 0;         /* initialize status before calling fitsio routines */

    if (fits_create_file(&fptr, filename, &status)) /* create new FITS file */
         printerror( status );           /* call printerror if error occurs */

    /* write the required keywords for the primary array image.     */
    /* Since bitpix = USHORT_IMG, this will cause cfitsio to create */
    /* a FITS image with BITPIX = 16 (signed short integers) with   */
    /* BSCALE = 1.0 and BZERO = 32768.  This is the convention that */
    /* FITS uses to store unsigned integers.  Note that the BSCALE  */
    /* and BZERO keywords will be automatically written by cfitsio  */
    /* in this case.                                                */

    if ( fits_create_img(fptr,  bitpix, naxis, naxes, &status) )
         printerror( status );          

    /* initialize the values in the image with a linear ramp function */
    for (jj = 0; jj < naxes[1]; jj++)
    {   for (ii = 0; ii < naxes[0]; ii++)
        {
            array[jj][ii] = ii + jj;
        }
    }

    fpixel = 1;                               /* first pixel to write      */
    nelements = naxes[0] * naxes[1];          /* number of pixels to write */

    /* write the array of unsigned integers to the FITS file */
    if ( fits_write_img(fptr, TUSHORT, fpixel, nelements, array[0], &status) )
        printerror( status );
      
    free( array[0] );  /* free previously allocated memory */

    /* write another optional keyword to the header */
    /* Note that the ADDRESS of the value is passed in the routine */
    exposure = 1500;
    if ( fits_update_key(fptr, TLONG, "EXPOSURE", &exposure,
         "Total Exposure Time", &status) )
         printerror( status );           

    if ( fits_close_file(fptr, &status) )                /* close the file */
         printerror( status );           

    return;
}